

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O2

hash_func_t getHasher(string *s)

{
  bool bVar1;
  code *pcVar2;
  ostream *poVar3;
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  bVar1 = std::operator==(s,"strings");
  if (bVar1) {
    pcVar2 = hashstring;
  }
  else {
    bVar1 = std::operator==(s,"all");
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar3 = std::operator<<(&local_190,"Unknown hash function: ");
      std::operator<<(poVar3,(string *)s);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_primitives.cc"
                 ,0x36,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pcVar2 = hashall;
  }
  return pcVar2;
}

Assistant:

hash_func_t getHasher(const std::string& s)
{
  if (s == "strings")
    return hashstring;
  else if (s == "all")
    return hashall;
  else
    THROW("Unknown hash function: " << s);
}